

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O3

void __thiscall
brynet::net::TcpService::startWorkerThread
          (TcpService *this,size_t threadNum,FRAME_CALLBACK *callback)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  element_type *peVar6;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  int iVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  bool *__tmp;
  pointer psVar11;
  EventLoop *this_00;
  long *local_e0;
  PTR local_d8;
  pthread_mutex_t *local_c8;
  pthread_mutex_t *local_c0;
  shared_ptr<std::thread> local_b8;
  _Any_data local_a8;
  code *local_98;
  long lStack_90;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  _func_int **local_68;
  _func_int **local_60;
  pointer local_58;
  FRAME_CALLBACK *local_50;
  element_type *local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  
  local_50 = callback;
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->mServiceGuard);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  local_c8 = (pthread_mutex_t *)&this->mIOLoopGuard;
  local_c0 = (pthread_mutex_t *)&this->mServiceGuard;
  iVar8 = pthread_mutex_lock(local_c8);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  if ((this->mIOLoopDatas).
      super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->mIOLoopDatas).
      super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var9->_M_use_count = 1;
    p_Var9->_M_weak_count = 1;
    p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00147cf0;
    *(undefined1 *)&p_Var9[1]._vptr__Sp_counted_base = 1;
    (this->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var9 + 1);
    p_Var1 = (this->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var9;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    std::
    vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
    ::resize(&this->mIOLoopDatas,threadNum);
    psVar11 = (this->mIOLoopDatas).
              super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_58 = (this->mIOLoopDatas).
               super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar11 != local_58) {
      local_60 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00147d40;
      local_68 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00147d90;
      do {
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xe0);
        p_Var9->_M_use_count = 1;
        p_Var9->_M_weak_count = 1;
        p_Var9->_vptr__Sp_counted_base = local_60;
        this_00 = (EventLoop *)(p_Var9 + 1);
        EventLoop::EventLoop(this_00);
        peVar2 = (this->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var1 = (this->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
        if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00123efe:
          if (__libc_single_threaded != '\0') goto LAB_00123f0c;
          LOCK();
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          UNLOCK();
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            UNLOCK();
            goto LAB_00123efe;
          }
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
LAB_00123f0c:
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        }
        local_d8.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             this_00;
        local_d8.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var9;
        std::function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)>::function
                  ((function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)> *)&local_a8,
                   local_50);
        if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00123f61:
          if (__libc_single_threaded != '\0') goto LAB_00123f6f;
          LOCK();
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          UNLOCK();
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            UNLOCK();
            goto LAB_00123f61;
          }
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
LAB_00123f6f:
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        }
        local_b8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_88 = peVar2;
        p_Stack_80 = p_Var1;
        local_78 = this_00;
        uStack_70 = p_Var9;
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
        p_Var10->_M_use_count = 1;
        p_Var10->_M_weak_count = 1;
        p_Var10->_vptr__Sp_counted_base = local_68;
        p_Var10[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_e0 = (long *)operator_new(0x48);
        p_Var3 = p_Stack_80;
        *local_e0 = (long)&PTR___State_impl_00147b08;
        local_e0[1] = 0;
        local_e0[2] = 0;
        local_e0[3] = 0;
        local_e0[4] = lStack_90;
        if (local_98 != (code *)0x0) {
          local_e0[1] = (long)local_a8._M_unused._0_8_;
          local_e0[2] = local_a8._8_8_;
          local_e0[3] = (long)local_98;
          local_98 = (code *)0x0;
          lStack_90 = 0;
        }
        p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_e0[5] = (long)local_88;
        local_e0[6] = (long)p_Var3;
        local_88 = (element_type *)0x0;
        uVar4 = (undefined4)uStack_70;
        uVar5 = uStack_70._4_4_;
        uStack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(undefined4 *)(local_e0 + 7) = (undefined4)local_78;
        *(undefined4 *)((long)local_e0 + 0x3c) = local_78._4_4_;
        *(undefined4 *)(local_e0 + 8) = uVar4;
        *(undefined4 *)((long)local_e0 + 0x44) = uVar5;
        local_78 = (EventLoop *)0x0;
        std::thread::_M_start_thread(p_Var10 + 1,&local_e0,0);
        if (local_e0 != (long *)0x0) {
          (**(code **)(*local_e0 + 8))();
        }
        local_b8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(p_Var10 + 1);
        local_b8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var10;
        IOLoopData::Create((IOLoopData *)&stack0xffffffffffffffb8,&local_d8,&local_b8);
        _Var7._M_pi = _Stack_40._M_pi;
        peVar6 = local_48;
        local_48 = (element_type *)0x0;
        _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var3 = (psVar11->super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        (psVar11->super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             peVar6;
        (psVar11->super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = _Var7._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        if (local_b8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_b8.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (uStack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_70);
        }
        if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
        }
        if (local_98 != (code *)0x0) {
          (*local_98)(&local_a8,&local_a8,__destroy_functor);
        }
        if (local_d8.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
        psVar11 = psVar11 + 1;
      } while (psVar11 != local_58);
    }
  }
  pthread_mutex_unlock(local_c8);
  pthread_mutex_unlock(local_c0);
  return;
}

Assistant:

void TcpService::startWorkerThread(size_t threadNum, FRAME_CALLBACK callback)
{
    std::lock_guard<std::mutex> lck(mServiceGuard);
    std::lock_guard<std::mutex> lock(mIOLoopGuard);

    if (!mIOLoopDatas.empty())
    {
        return;
    }

    mRunIOLoop = std::make_shared<bool>(true);

    mIOLoopDatas.resize(threadNum);
    for (auto& v : mIOLoopDatas)
    {
        auto eventLoop = std::make_shared<EventLoop>();
        auto runIoLoop = mRunIOLoop;
        v = IOLoopData::Create(eventLoop, std::make_shared<std::thread>([callback,
            runIoLoop,
            eventLoop]() {
            while (*runIoLoop)
            {
                auto timeout = std::chrono::milliseconds(sDefaultLoopTimeOutMS);
                if (!eventLoop->getTimerMgr()->isEmpty())
                {
                    timeout = duration_cast<milliseconds>(eventLoop->getTimerMgr()->nearLeftTime());
                }
                eventLoop->loop(timeout.count());
                if (callback != nullptr)
                {
                    callback(eventLoop);
                }
            }
        }));
    }
}